

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_trim_whitespace(char *dest,int dest_sz,char *src)

{
  _Bool _Var1;
  int iVar2;
  int local_3c;
  int local_38;
  int local_34;
  int i;
  int offset;
  int var__b;
  int var__a;
  int len;
  char *src_local;
  int dest_sz_local;
  char *dest_local;
  
  iVar2 = sx_strlen(src);
  local_3c = dest_sz + -1;
  if (iVar2 < local_3c) {
    local_3c = iVar2;
  }
  local_34 = 0;
  for (local_38 = 0; local_38 < local_3c; local_38 = local_38 + 1) {
    _Var1 = sx_isspace(src[local_38]);
    if (!_Var1) {
      dest[local_34] = src[local_38];
      local_34 = local_34 + 1;
    }
  }
  dest[local_34] = '\0';
  return dest;
}

Assistant:

char* sx_trim_whitespace(char* dest, int dest_sz, const char* src)
{
    int len = sx_min(sx_strlen(src), dest_sz - 1);
    int offset = 0;
    for (int i = 0; i < len; i++) {
        if (!sx_isspace(src[i]))
            dest[offset++] = src[i];
    }
    dest[offset] = '\0';
    return dest;
}